

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaBlast.c
# Opt level: O1

void Cba_BlastLess_rec(Gia_Man_t *pNew,int *pArg0,int *pArg1,int nBits,int *pYes,int *pNo)

{
  uint iLit0;
  uint iLit0_00;
  int iVar1;
  uint uVar2;
  int NoR;
  int YesR;
  int local_48;
  int local_44;
  uint *local_40;
  uint *local_38;
  
  if (nBits < 2) {
    if (nBits != 1) {
      __assert_fail("nBits == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cbaBlast.c"
                    ,0x117,"void Cba_BlastLess_rec(Gia_Man_t *, int *, int *, int, int *, int *)");
    }
    if (-1 < *pArg0) {
      iVar1 = Gia_ManHashAnd(pNew,*pArg0 ^ 1,*pArg1);
      *pYes = iVar1;
      if (-1 < *pArg1) {
        iVar1 = Gia_ManHashAnd(pNew,*pArg1 ^ 1,*pArg0);
        *pNo = iVar1;
        return;
      }
    }
  }
  else {
    uVar2 = nBits - 1;
    local_40 = (uint *)pYes;
    if (-1 < pArg0[uVar2]) {
      local_38 = (uint *)pNo;
      iLit0 = Gia_ManHashAnd(pNew,pArg0[uVar2] ^ 1,pArg1[uVar2]);
      if (-1 < pArg1[uVar2]) {
        iLit0_00 = Gia_ManHashAnd(pNew,pArg1[uVar2] ^ 1,pArg0[uVar2]);
        if (iLit0_00 == 1 || iLit0 == 1) {
          *local_40 = iLit0;
LAB_0033e7a4:
          *local_38 = iLit0_00;
          return;
        }
        Cba_BlastLess_rec(pNew,pArg0,pArg1,uVar2,&local_44,&local_48);
        if (-1 < (int)iLit0_00) {
          iVar1 = Gia_ManHashAnd(pNew,iLit0_00 ^ 1,local_44);
          uVar2 = Gia_ManHashOr(pNew,iLit0,iVar1);
          *local_40 = uVar2;
          if (-1 < (int)iLit0) {
            iVar1 = Gia_ManHashAnd(pNew,iLit0 ^ 1,local_48);
            iLit0_00 = Gia_ManHashOr(pNew,iLit0_00,iVar1);
            goto LAB_0033e7a4;
          }
        }
      }
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf4,"int Abc_LitNot(int)");
}

Assistant:

void Cba_BlastLess_rec( Gia_Man_t * pNew, int * pArg0, int * pArg1, int nBits, int * pYes, int * pNo )
{
    if ( nBits > 1 )
    {
        int Yes = Gia_ManHashAnd( pNew, Abc_LitNot(pArg0[nBits-1]), pArg1[nBits-1] ), YesR;
        int No  = Gia_ManHashAnd( pNew, Abc_LitNot(pArg1[nBits-1]), pArg0[nBits-1] ), NoR;
        if ( Yes == 1 || No == 1 )
        {
            *pYes = Yes;
            *pNo  = No;
            return;
        }
        Cba_BlastLess_rec( pNew, pArg0, pArg1, nBits-1, &YesR, &NoR );
        *pYes = Gia_ManHashOr( pNew, Yes, Gia_ManHashAnd(pNew, Abc_LitNot(No),  YesR) );
        *pNo  = Gia_ManHashOr( pNew, No,  Gia_ManHashAnd(pNew, Abc_LitNot(Yes), NoR ) );
        return;
    }
    assert( nBits == 1 );
    *pYes = Gia_ManHashAnd( pNew, Abc_LitNot(pArg0[0]), pArg1[0] );
    *pNo  = Gia_ManHashAnd( pNew, Abc_LitNot(pArg1[0]), pArg0[0] );
}